

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::CompareFieldValueUsingParentFields
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *field,int index1,int index2,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields)

{
  bool bVar1;
  ComparisonResult CVar2;
  CppType CVar3;
  Reflection *this_00;
  Reflection *this_01;
  SpecificField *specific_field_00;
  Message *local_98;
  Message *local_90;
  bool compare_result;
  SpecificField *specific_field;
  Message *m2;
  Message *m1;
  Reflection *reflection2;
  Reflection *reflection1;
  ComparisonResult result;
  FieldContext field_context;
  int index1_local;
  FieldDescriptor *field_local;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MessageDifferencer *this_local;
  
  field_context.parent_fields_._4_4_ = index1;
  FieldContext::FieldContext((FieldContext *)&stack0xffffffffffffffb8,parent_fields);
  CVar2 = GetFieldComparisonResult
                    (this,message1,message2,field,field_context.parent_fields_._4_4_,index2,
                     (FieldContext *)&stack0xffffffffffffffb8);
  CVar3 = FieldDescriptor::cpp_type(field);
  if ((CVar3 == CPPTYPE_MESSAGE) && (CVar2 == RECURSE)) {
    this_00 = Message::GetReflection(message1);
    this_01 = Message::GetReflection(message2);
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      local_90 = Reflection::GetRepeatedMessage
                           (this_00,message1,field,field_context.parent_fields_._4_4_);
    }
    else {
      local_90 = Reflection::GetMessage(this_00,message1,field,(MessageFactory *)0x0);
    }
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      local_98 = Reflection::GetRepeatedMessage(this_01,message2,field,index2);
    }
    else {
      local_98 = Reflection::GetMessage(this_01,message2,field,(MessageFactory *)0x0);
    }
    if (parent_fields ==
        (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
         *)0x0) {
      this_local._7_1_ = Compare(this,local_90,local_98);
    }
    else {
      specific_field_00 = PushSpecificField(parent_fields);
      specific_field_00->message1 = message1;
      specific_field_00->message2 = message2;
      specific_field_00->unpacked_any = unpacked_any;
      specific_field_00->field = field;
      AddSpecificIndex(specific_field_00,message1,field,field_context.parent_fields_._4_4_);
      AddSpecificNewIndex(specific_field_00,message2,field,index2);
      this_local._7_1_ = Compare(this,local_90,local_98,0,parent_fields);
      std::
      vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      ::pop_back(parent_fields);
    }
  }
  else {
    this_local._7_1_ = CVar2 == SAME;
  }
  return this_local._7_1_;
}

Assistant:

bool MessageDifferencer::CompareFieldValueUsingParentFields(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* field, int index1, int index2,
    std::vector<SpecificField>* parent_fields) {
  FieldContext field_context(parent_fields);
  FieldComparator::ComparisonResult result = GetFieldComparisonResult(
      message1, message2, field, index1, index2, &field_context);

  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
      result == FieldComparator::RECURSE) {
    // Get the nested messages and compare them using one of the Compare
    // methods.
    const Reflection* reflection1 = message1.GetReflection();
    const Reflection* reflection2 = message2.GetReflection();
    const Message& m1 =
        field->is_repeated()
            ? reflection1->GetRepeatedMessage(message1, field, index1)
            : reflection1->GetMessage(message1, field);
    const Message& m2 =
        field->is_repeated()
            ? reflection2->GetRepeatedMessage(message2, field, index2)
            : reflection2->GetMessage(message2, field);

    // parent_fields is used in calls to Reporter methods.
    if (parent_fields != nullptr) {
      // Append currently compared field to the end of parent_fields.
      SpecificField& specific_field = PushSpecificField(parent_fields);
      specific_field.message1 = &message1;
      specific_field.message2 = &message2;
      specific_field.unpacked_any = unpacked_any;
      specific_field.field = field;
      AddSpecificIndex(&specific_field, message1, field, index1);
      AddSpecificNewIndex(&specific_field, message2, field, index2);
      const bool compare_result = Compare(m1, m2, false, parent_fields);
      parent_fields->pop_back();
      return compare_result;
    } else {
      // Recreates parent_fields as if m1 and m2 had no parents.
      return Compare(m1, m2);
    }
  } else {
    return (result == FieldComparator::SAME);
  }
}